

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PalindromeTester.c
# Opt level: O0

int main(void)

{
  int iVar1;
  int iVar2;
  int numD;
  int numC;
  int numB;
  int numA;
  int flag;
  int number;
  
  flag = 0;
  numB = 1;
  printf("%s","Enter a 5 digit number: ");
  __isoc99_scanf("%d",&numA);
  while (numB != -1) {
    if (numA < 0x2711) {
      puts("You did not provide a 5 digit number!!!");
      printf("%s","Enter a 5 digit number: ");
      __isoc99_scanf("%d",&numA);
    }
    else if (numA < 99999) {
      iVar1 = numA / 10000;
      iVar2 = numA % 10000;
      numA = (iVar2 % 1000) % 100;
      if (iVar1 == numA % 10) {
        if (iVar2 / 1000 == numA / 10) {
          puts("The given number is a palindrome!!!");
        }
        else {
          puts("Not a palindrome!!!");
        }
      }
      else {
        puts("Not a palindrome!!!");
      }
      numB = -1;
    }
    else {
      puts("You did not provide a 5 digit number!!!");
      printf("%s","Enter a 5 digit number: ");
      __isoc99_scanf("%d",&numA);
    }
  }
  return 0;
}

Assistant:

int main (void) {
    int number;
    int flag = 1;
    int numA;
    int numB;
    int numC;
    int numD;

    printf("%s", "Enter a 5 digit number: ");
    scanf("%d", &number);
    while (flag != -1) {
        if (number > 10000) {
            if (number < 99999) {
                numA = number / 10000;
                number = number % 10000;
                numB = number / 1000;
                number = number % 1000;
                number = number % 100;
                numC = number / 10;
                numD = number % 10;
                if (numA == numD) {
                    if (numB == numC) {
                        puts("The given number is a palindrome!!!");

                    }
                    else
                        puts("Not a palindrome!!!");

                }
                else
                    puts("Not a palindrome!!!");

                flag = -1;

            }
            else {
                puts("You did not provide a 5 digit number!!!");
                printf("%s", "Enter a 5 digit number: ");
                scanf("%d", &number);

            }

        }
        else {
            puts("You did not provide a 5 digit number!!!");
            printf("%s", "Enter a 5 digit number: ");
            scanf("%d", &number);

        }

    }

    return 0;

}